

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O2

int sigfiddle_doinit(t_sigfiddle *x,long npoints,long npitch,long npeakanal,long npeakout)

{
  t_histopeak **pptVar1;
  int iVar2;
  ulong uVar3;
  t_peakout *ptVar4;
  ulong uVar5;
  t_float *ptVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar3 = 0x14;
  if (npeakout != 0 || npeakanal != 0) {
    uVar3 = npeakanal;
  }
  uVar9 = 100;
  if (uVar3 < 100) {
    uVar9 = uVar3;
  }
  uVar5 = 0;
  if ((long)uVar3 < 0) {
    uVar9 = uVar5;
  }
  uVar3 = 100;
  if ((ulong)npeakout < 100) {
    uVar3 = npeakout;
  }
  if (npeakout < 0) {
    uVar3 = uVar5;
  }
  uVar10 = 3;
  if ((ulong)npitch < 3) {
    uVar10 = npitch;
  }
  if (npitch < 1) {
    uVar10 = uVar5;
  }
  lVar7 = 0x400;
  if (npoints != 0) {
    lVar7 = npoints;
  }
  iVar2 = sigfiddle_setnpoints(x,(float)lVar7);
  if (iVar2 != 0) {
    ptVar4 = (t_peakout *)getbytes(uVar3 * 8);
    if (ptVar4 != (t_peakout *)0x0) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        ptVar4[uVar5].po_freq = 0.0;
        ptVar4[uVar5].po_amp = 0.0;
      }
      x->x_peakbuf = ptVar4;
      x->x_npeakout = (int)uVar3;
      x->x_npeakanal = (int)uVar9;
      x->x_phase = 0;
      x->x_histphase = 0;
      x->x_sr = 44100.0;
      ptVar6 = x->x_hist[0].h_pitches;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        x->x_hist[lVar7].h_noted = 0.0;
        x->x_hist[lVar7].h_age = 0;
        x->x_hist[lVar7].h_pitch = 0.0;
        pptVar1 = &x->x_hist[lVar7].h_wherefrom;
        *pptVar1 = (t_histopeak *)0x0;
        pptVar1[1] = (t_histopeak *)0x0;
        for (lVar8 = -0x50; lVar8 != 0; lVar8 = lVar8 + 4) {
          *(undefined4 *)((long)ptVar6 + lVar8 + 0x50) = 0;
          *(undefined4 *)((long)ptVar6 + lVar8) = 0;
        }
        ptVar6 = ptVar6 + 0x30;
      }
      x->x_nprint = 0;
      iVar2 = (int)uVar10;
      if (uVar10 == 0 && uVar9 != 0) {
        iVar2 = 1;
      }
      x->x_npitch = iVar2;
      for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
        x->x_dbs[lVar7] = 0.0;
      }
      x->x_peaked = 0.0;
      x->x_dbage = 0;
      x->x_auto = 1;
      x->x_amplo = 40.0;
      x->x_amphi = 50.0;
      x->x_attacktime = 100;
      x->x_attackbins = 1;
      x->x_attackthresh = 10.0;
      x->x_vibtime = 0x32;
      x->x_vibbins = 1;
      x->x_vibdepth = 0.5;
      x->x_npartial = 7.0;
      x->x_attackvalue = 0;
      return 1;
    }
    sigfiddle_freebird(x);
  }
  pd_error((void *)0x0,"fiddle~: out of memory");
  return 0;
}

Assistant:

int sigfiddle_doinit(t_sigfiddle *x, long npoints, long npitch,
    long npeakanal, long npeakout)
{
    t_float *buf1, *buf2,  *buf3;
    t_peakout *buf4;
    int i;

    if (!npeakanal && !npeakout) npeakanal = DEFNPEAK, npeakout = 0;
    if (npeakanal < 0) npeakanal = 0;
    else if (npeakanal > MAXPEAK) npeakanal = MAXPEAK;
    if (npeakout < 0) npeakout = 0;
    else if (npeakout > MAXPEAK) npeakout = MAXPEAK;
    if (npitch <= 0) npitch = 0;
    else if (npitch > MAXNPITCH) npitch = MAXNPITCH;
    if (npeakanal && !npitch) npitch = 1;
    if (!npoints)
        npoints = DEFAULTPOINTS;
    if (!sigfiddle_setnpoints(x, npoints))
    {
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    if (!(buf4 = (t_peakout *)getbytes(sizeof(*buf4) * npeakout)))
    {
        sigfiddle_freebird(x);
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    for (i = 0; i < npeakout; i++)
        buf4[i].po_freq = buf4[i].po_amp = 0;
    x->x_peakbuf = buf4;

    x->x_npeakout = (int)npeakout;
    x->x_npeakanal = (int)npeakanal;
    x->x_phase = 0;
    x->x_histphase = 0;
    x->x_sr = 44100;            /* this and the next are filled in later */
    for (i = 0; i < MAXNPITCH; i++)
    {
        int j;
        x->x_hist[i].h_pitch = x->x_hist[i].h_noted = 0;
        x->x_hist[i].h_age = 0;
        x->x_hist[i].h_wherefrom = 0;
        x->x_hist[i].h_outlet = 0;
        for (j = 0; j < HISTORY; j++)
            x->x_hist[i].h_amps[j] = x->x_hist[i].h_pitches[j] = 0;
    }
    x->x_nprint = 0;
    x->x_npitch = (int)npitch;
    for (i = 0; i < HISTORY; i++) x->x_dbs[i] = 0;
    x->x_dbage = 0;
    x->x_peaked = 0;
    x->x_auto = 1;
    x->x_amplo = DEFAMPLO;
    x->x_amphi = DEFAMPHI;
    x->x_attacktime = DEFATTACKTIME;
    x->x_attackbins = 1;                /* real value calculated afterward */
    x->x_attackthresh = DEFATTACKTHRESH;
    x->x_vibtime = DEFVIBTIME;
    x->x_vibbins = 1;                   /* real value calculated afterward */
    x->x_vibdepth = DEFVIBDEPTH;
    x->x_npartial = 7;
    x->x_attackvalue = 0;
    return (1);
}